

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_ctx.cc
# Opt level: O1

void __thiscall
hwtest::pgraph::MthdPatternBitmapColor::~MthdPatternBitmapColor(MthdPatternBitmapColor *this)

{
  pointer pcVar1;
  
  (this->super_SingleMthdTest).super_MthdTest.super_StateTest.super_RepeatTest.super_Test._vptr_Test
       = (_func_int **)&PTR__SingleMthdTest_00348698;
  pcVar1 = (this->super_SingleMthdTest).name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->super_SingleMthdTest).name.field_2) {
    operator_delete(pcVar1);
  }
  operator_delete(this);
  return;
}

Assistant:

void emulate_mthd() override {
		if (chipset.card_type < 4) {
			struct pgraph_color c = pgraph_expand_color(&exp, val);
			exp.pattern_mono_rgb[which] = c.r << 20 | c.g << 10 | c.b;
			exp.pattern_mono_a[which] = c.a;
		} else if (cls == 0x18) {
			nv04_pgraph_set_pattern_mono_color_nv01(&exp, which, val);
		} else {
			exp.pattern_mono_color[which] = val;
		}
	}